

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerNewRegEx(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  DWORD DVar6;
  Opnd *pOVar7;
  undefined4 *puVar8;
  Instr *pIVar9;
  RegOpnd *dstOpnd;
  SymOpnd *dst;
  SymOpnd *local_50;
  SymOpnd *tempObjectSymOpnd;
  Opnd *local_40;
  SymOpnd *local_38;
  
  pOVar7 = IR::Instr::UnlinkSrc1(instr);
  bVar2 = IR::Opnd::IsAddrOpnd(pOVar7);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2f14,"(src1->IsAddrOpnd())","src1->IsAddrOpnd()");
    if (!bVar2) goto LAB_0054dc76;
    *puVar8 = 0;
  }
  if (DAT_01459498 == '\x01') {
    if ((instr->m_dst->field_0xb & 0x10) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2f19,"(!instr->GetDst()->CanStoreTemp())",
                         "!instr->GetDst()->CanStoreTemp()");
      if (!bVar2) {
LAB_0054dc76:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar8 = 0;
    }
    LoadScriptContext(this,instr);
    pIVar9 = LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,pOVar7);
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,instr,HelperScrRegEx_OP_NewRegEx,(LabelInstr *)0x0,(Opnd *)0x0,
               (PropertySymOpnd *)0x0,false);
    return pIVar9;
  }
  tempObjectSymOpnd = (SymOpnd *)instr->m_prev;
  local_40 = pOVar7;
  pOVar7 = IR::Instr::UnlinkDst(instr);
  dstOpnd = IR::Opnd::AsRegOpnd(pOVar7);
  bVar2 = GenerateRecyclerOrMarkTempAlloc
                    (this,instr,dstOpnd,HelperAllocMemForJavascriptRegExp,0x40,&local_50);
  local_38 = (SymOpnd *)CONCAT71(local_38._1_7_,bVar2);
  if (local_50 == (SymOpnd *)0x0) {
LAB_0054db0a:
    pOVar7 = LoadVTableValueOpnd(this,instr,VtableJavascriptRegExp);
    GenerateMemInit(this,dstOpnd,0,pOVar7,instr,false);
  }
  else {
    uVar4 = Func::GetSourceContextId(this->m_func);
    uVar5 = Func::GetLocalFunctionId(this->m_func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,HoistMarkTempInitPhase,uVar4,uVar5);
    if ((bVar2) || (this->outerMostLoopLabel == (LabelInstr *)0x0)) goto LAB_0054db0a;
    pOVar7 = LoadVTableValueOpnd(this,&this->outerMostLoopLabel->super_Instr,VtableJavascriptRegExp)
    ;
    InsertMove(&local_50->super_Opnd,pOVar7,&this->outerMostLoopLabel->super_Instr,false);
  }
  DVar6 = Js::DynamicObject::GetOffsetOfType();
  pOVar7 = LoadLibraryValueOpnd(this,instr,ValueRegexType);
  GenerateMemInit(this,dstOpnd,DVar6,pOVar7,instr,false);
  DVar6 = Js::DynamicObject::GetOffsetOfAuxSlots();
  bVar2 = local_38._0_1_;
  GenerateMemInitNull(this,dstOpnd,DVar6,instr,local_38._0_1_);
  DVar6 = Js::DynamicObject::GetOffsetOfObjectArray();
  GenerateMemInitNull(this,dstOpnd,DVar6,instr,bVar2);
  local_38 = local_50;
  if (local_50 != (SymOpnd *)0x0) {
    uVar4 = Func::GetSourceContextId(this->m_func);
    uVar5 = Func::GetLocalFunctionId(this->m_func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,HoistMarkTempInitPhase,uVar4,uVar5);
    if ((!bVar3) && (this->outerMostLoopLabel != (LabelInstr *)0x0)) {
      dst = IR::SymOpnd::New(local_38->m_sym,local_38->m_offset + 0x20,TyUint64,this->m_func);
      InsertMove(&dst->super_Opnd,local_40,&this->outerMostLoopLabel->super_Instr,false);
      goto LAB_0054dc1d;
    }
  }
  GenerateMemInit(this,dstOpnd,0x20,local_40,instr,false);
LAB_0054dc1d:
  GenerateMemInitNull(this,dstOpnd,0x28,instr,bVar2);
  GenerateMemInitNull(this,dstOpnd,0x30,instr,bVar2);
  GenerateMemInit(this,dstOpnd,0x38,0,instr,bVar2);
  IR::Instr::Remove(instr);
  return (Instr *)tempObjectSymOpnd;
}

Assistant:

IR::Instr *
Lowerer::LowerNewRegEx(IR::Instr * instr)
{
    IR::Opnd *src1 = instr->UnlinkSrc1();

    Assert(src1->IsAddrOpnd());

#if ENABLE_REGEX_CONFIG_OPTIONS
    if (REGEX_CONFIG_FLAG(RegexTracing))
    {
        Assert(!instr->GetDst()->CanStoreTemp());
        IR::Instr * instrPrev = LoadScriptContext(instr);
        instrPrev = m_lowererMD.LoadHelperArgument(instr, src1);
        m_lowererMD.ChangeToHelperCall(instr, IR::HelperScrRegEx_OP_NewRegEx);
        return instrPrev;
    }
#endif
    IR::Instr * instrPrev = instr->m_prev;
    IR::RegOpnd * dstOpnd = instr->UnlinkDst()->AsRegOpnd();
    IR::SymOpnd * tempObjectSymOpnd;
    bool isZeroed = GenerateRecyclerOrMarkTempAlloc(instr, dstOpnd, IR::HelperAllocMemForJavascriptRegExp, sizeof(Js::JavascriptRegExp), &tempObjectSymOpnd);
    if (tempObjectSymOpnd && !PHASE_OFF(Js::HoistMarkTempInitPhase, this->m_func) && this->outerMostLoopLabel)
    {
        // Hoist the vtable and pattern init to the outer most loop top as it never changes
        InsertMove(tempObjectSymOpnd,
            LoadVTableValueOpnd(this->outerMostLoopLabel, VTableValue::VtableJavascriptRegExp),
            this->outerMostLoopLabel, false);
    }
    else
    {
        GenerateMemInit(dstOpnd, 0, LoadVTableValueOpnd(instr, VTableValue::VtableJavascriptRegExp), instr, isZeroed);
    }
    GenerateMemInit(dstOpnd, Js::JavascriptRegExp::GetOffsetOfType(),
        this->LoadLibraryValueOpnd(instr, LibraryValue::ValueRegexType), instr, isZeroed);
    GenerateMemInitNull(dstOpnd, Js::JavascriptRegExp::GetOffsetOfAuxSlots(), instr, isZeroed);
    GenerateMemInitNull(dstOpnd, Js::JavascriptRegExp::GetOffsetOfObjectArray(), instr, isZeroed);
    if (tempObjectSymOpnd && !PHASE_OFF(Js::HoistMarkTempInitPhase, this->m_func) && this->outerMostLoopLabel)
    {
        InsertMove(IR::SymOpnd::New(tempObjectSymOpnd->m_sym,
            tempObjectSymOpnd->m_offset + Js::JavascriptRegExp::GetOffsetOfPattern(), TyMachPtr, this->m_func),
            src1, this->outerMostLoopLabel, false);
    }
    else
    {
        GenerateMemInit(dstOpnd, Js::JavascriptRegExp::GetOffsetOfPattern(), src1, instr, isZeroed);
    }
    GenerateMemInitNull(dstOpnd, Js::JavascriptRegExp::GetOffsetOfSplitPattern(), instr, isZeroed);
    GenerateMemInitNull(dstOpnd, Js::JavascriptRegExp::GetOffsetOfLastIndexVar(), instr, isZeroed);
    GenerateMemInit(dstOpnd, Js::JavascriptRegExp::GetOffsetOfLastIndexOrFlag(), 0, instr, isZeroed);
    instr->Remove();

    return instrPrev;
}